

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::CommonFunctionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CommonFunctionTestInstance *this)

{
  ShaderSpec *symbols;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols_00;
  undefined1 *puVar1;
  ostringstream *poVar2;
  ostringstream *this_00;
  ostringstream *poVar3;
  ShaderExecutor *pSVar4;
  TestContext *pTVar5;
  TestStatus *__return_storage_ptr___00;
  int inNdx;
  int iVar6;
  int iVar7;
  long lVar8;
  MessageBuilder *this_01;
  int inNdx_1;
  long lVar9;
  int *value;
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  int local_2cc;
  VarValue local_2b0 [2];
  _Vector_base<void_*,_std::allocator<void_*>_> local_290;
  _Vector_base<void_*,_std::allocator<void_*>_> local_278;
  _Vector_base<void_*,_std::allocator<void_*>_> local_260;
  _Vector_base<void_*,_std::allocator<void_*>_> local_248;
  TestStatus *local_230;
  ostringstream *local_228;
  int *local_220;
  CommonFunctionTestInstance *local_218;
  _Vector_base<int,_std::allocator<int>_> local_210;
  _Vector_base<int,_std::allocator<int>_> local_1f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  MessageBuilder local_1b0;
  
  symbols = &this->m_spec;
  iVar6 = computeTotalScalarSize(&symbols->inputs);
  symbols_00 = &(this->m_spec).outputs;
  iVar7 = computeTotalScalarSize(symbols_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,
             (long)(iVar6 * this->m_numValues),(allocator_type *)&local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,
             (long)(iVar7 * this->m_numValues),(allocator_type *)&local_1b0);
  value = &this->m_numValues;
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_260,&symbols->inputs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,*value);
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_248,symbols_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,*value);
  (*(this->super_TestInstance)._vptr_TestInstance[3])
            (this,(ulong)(uint)this->m_numValues,local_260._M_impl.super__Vector_impl_data._M_start)
  ;
  pSVar4 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar4->_vptr_ShaderExecutor[2])
            (pSVar4,(ulong)(uint)this->m_numValues,
             local_260._M_impl.super__Vector_impl_data._M_start,
             local_248._M_impl.super__Vector_impl_data._M_start,0);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_1f8,&symbols->inputs);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_210,symbols_00);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_290,
             (long)local_260._M_impl.super__Vector_impl_data._M_finish -
             (long)local_260._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_1b0);
  local_230 = __return_storage_ptr__;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_278,
             (long)local_248._M_impl.super__Vector_impl_data._M_finish -
             (long)local_248._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_1b0);
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
  local_228 = &this->m_failMsg;
  puVar1 = &this->field_0xa0;
  poVar2 = &local_1b0.m_str;
  this_00 = &local_1b0.m_str;
  local_2cc = 0;
  local_220 = value;
  local_218 = this;
  for (iVar6 = 0; iVar6 < *value; iVar6 = iVar6 + 1) {
    for (lVar8 = 0;
        lVar8 < (int)((ulong)((long)local_290._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_290._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar8 = lVar8 + 1) {
      local_290._M_impl.super__Vector_impl_data._M_start[lVar8] =
           (void *)((long)(local_1f8._M_impl.super__Vector_impl_data._M_start[lVar8] * iVar6) * 4 +
                   (long)local_260._M_impl.super__Vector_impl_data._M_start[lVar8]);
    }
    lVar8 = 0;
    while( true ) {
      if ((int)((ulong)((long)local_278._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_278._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar8)
      break;
      local_278._M_impl.super__Vector_impl_data._M_start[lVar8] =
           (void *)((long)(local_210._M_impl.super__Vector_impl_data._M_start[lVar8] * iVar6) * 4 +
                   (long)local_248._M_impl.super__Vector_impl_data._M_start[lVar8]);
      lVar8 = lVar8 + 1;
    }
    iVar7 = (*(this->super_TestInstance)._vptr_TestInstance[4])
                      (this,local_290._M_impl.super__Vector_impl_data._M_start);
    if ((char)iVar7 == '\0') {
      local_1b0.m_log = pTVar5->m_log;
      poVar3 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"ERROR: comparison failed for value ");
      std::ostream::operator<<(poVar3,iVar6);
      std::operator<<((ostream *)poVar3,":\n  ");
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&local_1b0.m_str,(string *)local_2b0);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      local_1b0.m_log = pTVar5->m_log;
      poVar3 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"  inputs:");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      lVar9 = 0;
      for (lVar8 = 0;
          lVar8 < (int)((ulong)((long)local_290._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_290._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar8 = lVar8 + 1) {
        local_1b0.m_log = pTVar5->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"    ");
        std::operator<<((ostream *)poVar2,
                        (string *)
                        ((long)&(((symbols->inputs).
                                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                        + lVar9));
        std::operator<<((ostream *)poVar2," = ");
        local_2b0[0].type =
             (VarType *)
             ((long)&(((symbols->inputs).
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar9);
        local_2b0[0].value = local_290._M_impl.super__Vector_impl_data._M_start[lVar8];
        tcu::MessageBuilder::operator<<(&local_1b0,local_2b0);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        lVar9 = lVar9 + 0x38;
      }
      local_1b0.m_log = pTVar5->m_log;
      poVar3 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"  outputs:");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      lVar9 = 0;
      for (lVar8 = 0;
          lVar8 < (int)((ulong)((long)local_278._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_278._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar8 = lVar8 + 1) {
        local_1b0.m_log = pTVar5->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"    ");
        std::operator<<((ostream *)this_00,
                        (string *)
                        ((long)&(((symbols_00->
                                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p + lVar9));
        std::operator<<((ostream *)this_00," = ");
        local_2b0[0].type =
             (VarType *)
             ((long)&(((symbols_00->
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar9);
        local_2b0[0].value = local_278._M_impl.super__Vector_impl_data._M_start[lVar8];
        tcu::MessageBuilder::operator<<(&local_1b0,local_2b0);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        lVar9 = lVar9 + 0x38;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"",(allocator<char> *)local_2b0);
      std::__cxx11::stringbuf::str((string *)puVar1);
      this = local_218;
      value = local_220;
      std::__cxx11::string::~string((string *)&local_1b0);
      std::ios::clear((int)*(undefined8 *)(*(long *)local_228 + -0x18) + (int)local_228);
      local_2cc = local_2cc + 1;
    }
  }
  local_1b0.m_log = pTVar5->m_log;
  poVar2 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::ostream::operator<<(poVar2,*value - local_2cc);
  __return_storage_ptr___00 = local_230;
  std::operator<<((ostream *)poVar2," / ");
  this_01 = tcu::MessageBuilder::operator<<(&local_1b0,value);
  std::operator<<((ostream *)&this_01->m_str," values passed");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  if (local_2cc == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Pass",(allocator<char> *)local_2b0);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&local_1b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Result comparison failed",(allocator<char> *)local_2b0);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_278);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_290);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_210);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1f8);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_248);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_260);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus CommonFunctionTestInstance::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;
		tcu::TestContext&		testCtx				= m_context.getTestContext();

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		if (numFailed == 0)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Result comparison failed");
	}
}